

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeBenchmark.cpp
# Opt level: O0

void __thiscall TreeBenchmark::TreeBenchmark(TreeBenchmark *this,unsigned_long vertices)

{
  vec_adj_list_impl<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_78;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_48;
  boost *local_28;
  Vertex i;
  boost *pbStack_18;
  int offset;
  unsigned_long vertices_local;
  TreeBenchmark *this_local;
  
  pbStack_18 = (boost *)vertices;
  vertices_local = (unsigned_long)this;
  Benchmark::Benchmark(&this->super_Benchmark);
  (this->super_Benchmark)._vptr_Benchmark = (_func_int **)&PTR_getDeletionsTime_00149cd0;
  i._4_4_ = 1;
  for (local_28 = (boost *)0x0; (local_28 <= pbStack_18 && (local_28 + i._4_4_ <= pbStack_18));
      local_28 = local_28 + 1) {
    boost::
    add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
              (&local_48,local_28,(vertex_descriptor)(local_28 + i._4_4_),
               (vertex_descriptor)&(this->super_Benchmark).G,in_R8);
    i._4_4_ = i._4_4_ + 1;
    if (pbStack_18 < local_28 + i._4_4_) {
      return;
    }
    boost::
    add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
              (&local_78,local_28,(vertex_descriptor)(local_28 + i._4_4_),
               (vertex_descriptor)&(this->super_Benchmark).G,in_R8);
  }
  return;
}

Assistant:

TreeBenchmark::TreeBenchmark(unsigned long vertices)
{
    int offset = 1;
    for (Vertex i=0; i<=vertices; ++i) {
        if (offset+i > vertices) {
            break;
        }
        add_edge(i, i+offset, G);
        offset++;
        if (offset+i > vertices) {
            break;
        }
        add_edge(i, i+offset, G);
    }
}